

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O3

void __thiscall geemuboi::test::core::CpuTest_ld_h_d8_Test::TestBody(CpuTest_ld_h_d8_Test *this)

{
  FunctionMocker<unsigned_char_(unsigned_short)> *this_00;
  undefined2 uVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  TypedExpectation<unsigned_char_(unsigned_short)> *this_01;
  char *message;
  AssertionResult gtest_ar;
  Registers expected_regs;
  linked_ptr<int> local_a0;
  Matcher<unsigned_short> local_90;
  undefined1 local_78 [16];
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  linked_ptr<testing::ActionInterface<unsigned_char_(unsigned_short)>_> local_58;
  MockSpec<unsigned_char_(unsigned_short)> local_40;
  
  (this->super_CpuTest).regs.f = 0xf0;
  uVar1 = (this->super_CpuTest).regs.pc;
  testing::Matcher<unsigned_short>::Matcher(&local_90,uVar1 + 1);
  this_00 = &(this->super_CpuTest).mmu.gmock1_read_byte_10;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,&(this->super_CpuTest).mmu);
  testing::internal::FunctionMocker<unsigned_char_(unsigned_short)>::With
            (&local_40,this_00,&local_90);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
                       ,0x334,"mmu","read_byte(regs.pc + 1)");
  local_a0.value_ = (int *)operator_new(4);
  *local_a0.value_ = 0x33;
  local_a0.link_.next_ = &local_a0.link_;
  local_58.value_ = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  (local_58.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_001afd68;
  *(undefined4 *)&local_58.value_[1]._vptr_ActionInterface = 0x33;
  *(undefined1 *)((long)&local_58.value_[1]._vptr_ActionInterface + 4) = 0x33;
  local_58.link_.next_ = &local_58.link_;
  local_68 = (_Manager_type)0x0;
  p_Stack_60 = (_Invoker_type)0x0;
  local_78._0_8_ = (void *)0x0;
  local_78._8_8_ = (undefined8 *)0x0;
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (this_01,(Action<unsigned_char_(unsigned_short)> *)local_78);
  testing::internal::linked_ptr<testing::ActionInterface<unsigned_char_(unsigned_short)>_>::
  ~linked_ptr(&local_58);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)((_Any_data *)local_78,(_Any_data *)local_78,__destroy_functor);
  }
  testing::internal::linked_ptr<int>::depart(&local_a0);
  local_40.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
  super_MatcherBase<unsigned_short>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001acdc8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::
  ~linked_ptr(&local_40.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>_>.
               super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
               super_MatcherBase<unsigned_short>.impl_);
  local_90.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001acdc8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::
  ~linked_ptr(&local_90.super_MatcherBase<unsigned_short>.impl_);
  CpuTest::execute_instruction(&this->super_CpuTest,'&');
  uVar2 = (ulong)local_40.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>_>.
                 super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
                 super_MatcherBase<unsigned_short>._vptr_MatcherBase >> 0x10;
  local_40.function_mocker_ =
       (FunctionMockerBase<unsigned_char_(unsigned_short)> *)0xf000330000000000;
  local_40.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
  super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)CONCAT62((uint6)uVar2 & 0xffffffff0000,2);
  CpuTest::verify_state_changes(&this->super_CpuTest,(Registers *)&local_40);
  iVar4 = (*((this->super_CpuTest).cpu._M_t.
             super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>
             ._M_t.
             super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>
             .super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl)->_vptr_ICpu[1])();
  local_90.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)
       CONCAT44(local_90.super_MatcherBase<unsigned_short>._vptr_MatcherBase._4_4_,iVar4);
  local_a0.value_ = (int *)CONCAT44(local_a0.value_._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_78,"cpu->get_cycles_executed()","2",(uint *)&local_90,
             (int *)&local_a0);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)local_78._8_8_ == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x33e,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if (local_90.super_MatcherBase<unsigned_short>._vptr_MatcherBase != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_90.super_MatcherBase<unsigned_short>._vptr_MatcherBase != (_func_int **)0x0)) {
        (**(code **)(*local_90.super_MatcherBase<unsigned_short>._vptr_MatcherBase + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_78 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(CpuTest, ld_h_d8) {
    regs.f = ICpu::C_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::Z_FLAG;

    EXPECT_CALL(mmu, read_byte(regs.pc + 1)).WillOnce(Return(0x33));

    execute_instruction(0x26);

    ICpu::Registers expected_regs{};
    expected_regs.h = 0x33;
    expected_regs.f = ICpu::C_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::Z_FLAG;
    expected_regs.pc = 2;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}